

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O3

BrailleCanvas * __thiscall
plot::BrailleCanvas::ellipse(BrailleCanvas *this,Color *color,Rect rct,TerminalOp op)

{
  Rect rct_00;
  Rect rct_01;
  Rect rct_02;
  Rect rct_03;
  long lVar1;
  BrailleCanvas *pBVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  anon_class_32_4_b873ab05 local_b0;
  anon_class_32_4_b873ab04 local_90;
  anon_class_32_4_b873ab05 local_70;
  anon_class_32_4_b873ab04 local_50;
  
  lVar1 = rct.p1.y - rct.p2.y;
  if (rct.p1.y - rct.p2.y == 0 || rct.p1.y < rct.p2.y) {
    lVar1 = -(rct.p1.y - rct.p2.y);
  }
  lVar5 = rct.p1.x - rct.p2.x;
  lVar4 = lVar5;
  if (lVar5 == 0 || rct.p1.x < rct.p2.x) {
    lVar4 = -(rct.p1.x - rct.p2.x);
  }
  lVar8 = rct.p2.x;
  if (rct.p1.x < rct.p2.x) {
    lVar8 = rct.p1.x;
  }
  if (lVar5 != 0 && rct.p2.x <= rct.p1.x) {
    rct.p2.x = rct.p1.x;
  }
  lVar5 = rct.p2.y;
  if (rct.p1.y < rct.p2.y) {
    lVar5 = rct.p1.y;
  }
  if (rct.p2.y < rct.p1.y) {
    rct.p2.y = rct.p1.y;
  }
  lVar6 = -lVar4;
  if (0 < lVar4) {
    lVar6 = lVar4;
  }
  lVar4 = -lVar1;
  if (0 < lVar1) {
    lVar4 = lVar1;
  }
  uVar3 = lVar6 + 1;
  fVar9 = 2.0 / (float)(long)uVar3;
  lVar7 = (lVar4 + 1U >> 1) - (ulong)(~(uint)(lVar4 + 1U) & 1);
  lVar4 = (uVar3 >> 1) + lVar8;
  lVar6 = (uVar3 | 0xfffffffffffffffe) + lVar4 + 1;
  lVar1 = lVar5 + lVar7;
  pBVar2 = push(this);
  rct_00.p1.y = lVar5;
  rct_00.p1.x = lVar8;
  rct_00.p2.x = lVar6;
  rct_00.p2.y = lVar1;
  local_50.x_fac = fVar9;
  local_50.y_fac = lVar7;
  local_50.cy = lVar1;
  local_50.x0 = lVar8;
  pBVar2 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_1_>
                     (pBVar2,color,rct_00,&local_50,Over);
  lVar4 = (uVar3 | 0xfffffffffffffffe) + lVar4 + 2;
  rct_01.p1.y = lVar5;
  rct_01.p1.x = lVar4;
  rct_01.p2.x = rct.p2.x;
  rct_01.p2.y = lVar1;
  local_70.x_fac = fVar9;
  local_70.y_fac = lVar7;
  local_70.cy = lVar1;
  local_70.x1 = rct.p2.x;
  pBVar2 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_2_>
                     (pBVar2,color,rct_01,&local_70,Over);
  lVar5 = lVar5 + lVar7 + 1;
  rct_02.p1.y = lVar5;
  rct_02.p1.x = lVar8;
  rct_02.p2.x = lVar6;
  rct_02.p2.y = rct.p2.y;
  local_90.x_fac = fVar9;
  local_90.y_fac = lVar7;
  local_90.cy = lVar1;
  local_90.x0 = lVar8;
  pBVar2 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_3_>
                     (pBVar2,color,rct_02,&local_90,Over);
  rct_03.p1.y = lVar5;
  rct_03.p1.x = lVar4;
  rct_03.p2.x = rct.p2.x;
  rct_03.p2.y = rct.p2.y;
  local_b0.x_fac = fVar9;
  local_b0.y_fac = lVar7;
  local_b0.cy = lVar1;
  local_b0.x1 = rct.p2.x;
  pBVar2 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_4_>
                     (pBVar2,color,rct_03,&local_b0,Over);
  pBVar2 = pop(pBVar2,op);
  return pBVar2;
}

Assistant:

BrailleCanvas& ellipse(Color const& color, Rect rct, TerminalOp op = TerminalOp::Over) {
        rct = rct.sorted();
        auto size_ = rct.size() + Point(1, 1);

        float x_fac = 2.0f/size_.x;
        Coord y_fac = size_.y/2 - (!(size_.y % 2)),
              cx = rct.p1.x + (size_.x/cell_cols) - (!(size_.x % cell_cols)),
              cy = rct.p1.y + y_fac;

        return push()
              .stroke(color, { rct.p1, { cx, cy } }, [x_fac,y_fac,cy,x0=rct.p1.x](Coord x) {
                  auto x_over_a = ((x - x0) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x - x0) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy - std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(color, { { cx + 1, rct.p1.y }, { rct.p2.x, cy } }, [x_fac,y_fac,cy,x1=rct.p2.x](Coord x) {
                  auto x_over_a = ((x1 - x) * x_fac) - 1.0f,
                       next_x_over_a = ((x1 - x + 1) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy - std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(color, { { rct.p1.x, cy + 1 }, { cx, rct.p2.y } }, [x_fac,y_fac,cy,x0=rct.p1.x](Coord x) {
                  auto x_over_a = ((x - x0) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x - x0) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy + std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(color, { { cx + 1, cy + 1 }, rct.p2 }, [x_fac,y_fac,cy,x1=rct.p2.x](Coord x) {
                  auto x_over_a = ((x1 - x) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x1 - x) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy + std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .pop(op);
    }